

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_render_texture_attach(rf_render_texture2d target,uint id,int attach_type)

{
  int attach_type_local;
  uint id_local;
  
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,target.id);
  if (attach_type == 0) {
    (*(rf__ctx->field_0).gfx_ctx.gl.FramebufferTexture2D)(0x8d40,0x8ce0,0xde1,id,0);
  }
  else if (attach_type == 1) {
    if (target.depth_texture == 0) {
      (*(rf__ctx->field_0).gfx_ctx.gl.FramebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,id);
    }
    else {
      (*(rf__ctx->field_0).gfx_ctx.gl.FramebufferTexture2D)(0x8d40,0x8d00,0xde1,id,0);
    }
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,0);
  return;
}

Assistant:

RF_API void rf_gfx_render_texture_attach(rf_render_texture2d target, unsigned int id, int attach_type)
{
    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, target.id);

    if (attach_type == 0) rf_gl.FramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, id, 0);
    else if (attach_type == 1)
    {
        if (target.depth_texture) rf_gl.FramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, id, 0);
        else rf_gl.FramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, id);
    }

    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, 0);
}